

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::io::anon_unknown_0::PrinterTest_PreserveNewlinesThroughEmits_Test::
~PrinterTest_PreserveNewlinesThroughEmits_Test(PrinterTest_PreserveNewlinesThroughEmits_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_PrinterTest).super_Test._vptr_Test = (_func_int **)&PTR__PrinterTest_018e8740;
  if ((this->super_PrinterTest).stream_.
      super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>._M_payload.
      super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::io::StringOutputStream>._M_engaged == true) {
    (this->super_PrinterTest).stream_.
    super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>._M_payload.
    super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>.
    super__Optional_payload_base<google::protobuf::io::StringOutputStream>._M_engaged = false;
  }
  pcVar2 = (this->super_PrinterTest).out_._M_dataplus._M_p;
  paVar1 = &(this->super_PrinterTest).out_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F(PrinterTest, PreserveNewlinesThroughEmits) {
  {
    Printer printer(output());
    const std::vector<std::string> insertion_lines = {"// line 1", "// line 2"};
    printer.Emit(
        {
            {"insert_lines",
             [&] {
               for (const auto& line : insertion_lines) {
                 printer.Emit({{"line", line}}, R"cc(
                   $line$
                 )cc");
               }
             }},
        },
        R"cc(
          // one
          // two

          $insert_lines$;

          // three
          // four
        )cc");
  }
  EXPECT_EQ(written(),
            "// one\n"
            "// two\n"
            "\n"
            "// line 1\n"
            "// line 2\n"
            "\n"
            "// three\n"
            "// four\n");
}